

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamCoreRandom.hpp
# Opt level: O1

void TasDREAM::genGaussianSamples
               (vector<double,_std::allocator<double>_> *means,
               vector<double,_std::allocator<double>_> *deviations,int num_samples,
               vector<double,_std::allocator<double>_> *x,function<double_()> *get_random01)

{
  pointer __s;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  runtime_error *this;
  size_type __new_size;
  double *pdVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  double local_38;
  
  lVar7 = (long)(means->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(means->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_40 = means;
  if (lVar7 != (long)(deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
LAB_001107f6:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,
               "ERROR: genGaussianSamples() means and deviations vectors must have the same size.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __new_size = (long)num_samples * (lVar7 >> 3);
  if ((long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_finish -
      (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
            ._M_start >> 3 != __new_size) {
    std::vector<double,_std::allocator<double>_>::resize(x,__new_size);
  }
  __s = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_start;
  lVar7 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)__s;
  if (lVar7 != 0) {
    memset(__s,0,(lVar7 - 8U & 0xfffffffffffffff8) + 8);
  }
  std::function<double_()>::function((function<double_()> *)&local_60,get_random01);
  pdVar8 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar8 != pdVar1) {
    bVar9 = false;
    dVar10 = 0.0;
    do {
      if (!bVar9) {
        if (local_50 != (code *)0x0) {
          dVar10 = (*local_48)(&local_60);
          dVar11 = log(dVar10);
          dVar11 = dVar11 * -2.0;
          if (dVar11 < 0.0) {
            dVar11 = sqrt(dVar11);
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          if (local_50 != (code *)0x0) {
            local_38 = (*local_48)(&local_60);
            local_38 = local_38 * 6.283185307179586;
            dVar10 = cos(local_38);
            *pdVar8 = dVar10 * dVar11 + *pdVar8;
            dVar10 = sin(local_38);
            dVar10 = dVar10 * dVar11;
            goto LAB_00110766;
          }
        }
        std::__throw_bad_function_call();
        goto LAB_001107f6;
      }
      *pdVar8 = *pdVar8 + dVar10;
LAB_00110766:
      bVar9 = (bool)(bVar9 ^ 1);
      pdVar8 = pdVar8 + 1;
    } while (pdVar8 != pdVar1);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  pdVar8 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar8 != pdVar1) {
    pdVar2 = (local_40->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (deviations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar5 = pdVar2;
    pdVar6 = pdVar3;
    do {
      for (; pdVar6 != pdVar4; pdVar6 = pdVar6 + 1) {
        dVar10 = *pdVar6;
        dVar11 = *pdVar8;
        *pdVar8 = dVar10 * dVar11;
        *pdVar8 = dVar10 * dVar11 + *pdVar5;
        pdVar8 = pdVar8 + 1;
        pdVar5 = pdVar5 + 1;
      }
      pdVar5 = pdVar2;
      pdVar6 = pdVar3;
    } while (pdVar8 != pdVar1);
  }
  return;
}

Assistant:

inline void genGaussianSamples(const std::vector<double> &means, const std::vector<double> &deviations,
                               int num_samples, std::vector<double> &x, std::function<double(void)> get_random01 = tsgCoreUniform01){
    if (means.size() != deviations.size()) throw std::runtime_error("ERROR: genGaussianSamples() means and deviations vectors must have the same size.");
    if (x.size() != means.size() * num_samples) x.resize(means.size() * num_samples);

    std::fill_n(x.data(), x.size(), 0.0);
    applyGaussianUpdate(x, 1.0, get_random01);

    auto ix = x.begin();
    while(ix != x.end()){
        auto im = means.begin();
        for(auto s : deviations){
            *ix *= s;
            *ix++ += *im++;
        }
    }
}